

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O1

void __thiscall mir::types::FunctionTy::display(FunctionTy *this,ostream *o)

{
  element_type *peVar1;
  pointer psVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"Fn(",3);
  psVar2 = (this->params).
           super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar2 != (this->params).
                super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (psVar2 != (this->params).
                    super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
        std::__ostream_insert<char,std::char_traits<char>>(o,", ",2);
      }
      peVar1 = (psVar2->super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (**(peVar1->super_Displayable)._vptr_Displayable)(peVar1,o);
      psVar2 = psVar2 + 1;
    } while (psVar2 != (this->params).
                       super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,") -> ",5);
  peVar1 = (this->ret).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (**(peVar1->super_Displayable)._vptr_Displayable)(peVar1,o);
  return;
}

Assistant:

void FunctionTy::display(std::ostream& o) const {
  o << "Fn(";
  for (auto i = params.begin(); i != params.end(); i++) {
    if (i != params.begin()) o << ", ";
    o << **i;
  }
  o << ") -> " << *ret;
}